

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O3

void __thiscall QKeySequenceEdit::setKeySequence(QKeySequenceEdit *this,QKeySequence *keySequence)

{
  QKeySequenceEditPrivate *this_00;
  QLineEdit *this_01;
  int *piVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long in_FS_OFFSET;
  QString local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QKeySequenceEditPrivate **)(this + 8);
  QKeySequenceEditPrivate::resetState(this_00);
  cVar2 = QKeySequence::operator==(&this_00->keySequence,keySequence);
  if (cVar2 != '\0') goto LAB_0040c74f;
  uVar3 = QKeySequence::count();
  uVar5 = this_00->maximumSequenceLength;
  if ((int)uVar5 < (int)uVar3) {
    local_58.d.d._0_4_ = 2;
    local_58.d.d._4_4_ = 0;
    local_58.d.ptr._0_4_ = 0;
    local_58.d.ptr._4_4_ = 0;
    local_58.d.size._0_4_ = 0;
    local_58.d.size._4_4_ = 0;
    local_40 = "default";
    QMessageLogger::warning
              ((char *)&local_58,
               "QKeySequenceEdit: setting a key sequence of length %d when maximumSequenceLength is %d, truncating."
               ,(ulong)uVar3);
    uVar5 = this_00->maximumSequenceLength;
  }
  if ((int)uVar5 < (int)uVar3) {
    uVar3 = uVar5;
  }
  this_00->keyNum = uVar3;
  if ((int)uVar3 < 1) {
LAB_0040c6be:
    memset(this_00->key + (int)uVar3,0,(ulong)(3 - uVar3) * 4 + 4);
  }
  else {
    lVar6 = 0;
    do {
      iVar4 = QKeySequence::operator[]((uint)keySequence);
      this_00->key[lVar6].combination = iVar4;
      lVar6 = lVar6 + 1;
      uVar3 = this_00->keyNum;
    } while (lVar6 < (int)uVar3);
    if ((int)uVar3 < 4) goto LAB_0040c6be;
  }
  QKeySequenceEditPrivate::rebuildKeySequence(this_00);
  this_01 = this_00->lineEdit;
  QKeySequence::toString((SequenceFormat)&local_58);
  QLineEdit::setText(this_01,&local_58);
  piVar1 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),2,0x10);
    }
  }
  local_58.d.d._0_4_ = 0;
  local_58.d.d._4_4_ = 0;
  local_58.d.ptr = (char16_t *)&this_00->keySequence;
  QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)&local_58);
LAB_0040c74f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QKeySequenceEdit::setKeySequence(const QKeySequence &keySequence)
{
    Q_D(QKeySequenceEdit);

    d->resetState();

    if (d->keySequence == keySequence)
        return;

    const auto desiredCount = keySequence.count();
    if (desiredCount > d->maximumSequenceLength) {
        qWarning("QKeySequenceEdit: setting a key sequence of length %d "
                 "when maximumSequenceLength is %d, truncating.",
                 desiredCount, d->maximumSequenceLength);
    }

    d->keyNum = std::min(desiredCount, d->maximumSequenceLength);
    for (int i = 0; i < d->keyNum; ++i)
        d->key[i] = keySequence[i];
    for (int i = d->keyNum; i < QKeySequencePrivate::MaxKeyCount; ++i)
        d->key[i] = QKeyCombination::fromCombined(0);

    d->rebuildKeySequence();

    d->lineEdit->setText(d->keySequence.toString(QKeySequence::NativeText));

    emit keySequenceChanged(d->keySequence);
}